

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::revert(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  QMainWindowLayoutState *this_00;
  QArrayDataPointer<int> *this_01;
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QRect QVar2;
  QArrayDataPointer<int> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    iVar1 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
    this_00 = (QMainWindowLayoutState *)(this + 0x88);
    QMainWindowLayoutState::operator=(this_00,(QMainWindowLayoutState *)(this + 0x3c0));
    QMainWindowLayoutState::indexOf
              ((QList<int> *)&local_50,this_00,(QWidget *)CONCAT44(extraout_var,iVar1));
    this_01 = (QArrayDataPointer<int> *)(this + 0x7b0);
    QArrayDataPointer<int>::operator=(this_01,&local_50);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_50);
    if (*(long *)(this + 0x7c0) != 0) {
      fixToolBarOrientation(widgetItem,*(int *)(*(long *)(this + 0x7b8) + 4));
      QMainWindowLayoutState::unplug(this_00,(QList<int> *)this_01,(QMainWindowLayoutState *)0x0);
      QMainWindowLayoutState::fitLayout(this_00);
      QVar2 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)this_01);
      *(QRect *)(this + 0x7c8) = QVar2;
      plug(this,widgetItem);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::revert(QLayoutItem *widgetItem)
{
    if (!savedState.isValid())
        return;

    QWidget *widget = widgetItem->widget();
    layoutState = savedState;
    currentGapPos = layoutState.indexOf(widget);
    if (currentGapPos.isEmpty())
        return;
    fixToolBarOrientation(widgetItem, currentGapPos.at(1));
    layoutState.unplug(currentGapPos);
    layoutState.fitLayout();
    currentGapRect = layoutState.itemRect(currentGapPos);

    plug(widgetItem);
}